

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void create_ship_proc(Am_Object *command_obj)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object local_70;
  Am_Object local_68;
  Am_Value_List local_60 [32];
  Am_Object local_40;
  Am_Object local_38;
  Am_Object new_ship;
  char *ship_name;
  int l;
  SP_Ship_Type ship_type;
  int y;
  int x;
  int clip_y;
  int clip_x;
  Am_Object *command_obj_local;
  
  _clip_y = command_obj;
  pAVar4 = (Am_Value *)Am_Object::Get(0x3468,0x11f);
  x = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get(0x3468,0x120);
  y = Am_Value::operator_cast_to_int(pAVar4);
  Am_Translate_Coordinates((Am_Object *)&SP_Clip_Win,x,y,(Am_Object *)&SP_Ship_Agg,&ship_type,&l);
  pAVar4 = (Am_Value *)Am_Object::Get(0x33d0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (y < iVar3 / 2) {
    ship_name._4_4_ = 1;
    new_ship.data = (Am_Object_Data *)anon_var_dwarf_2f3d;
  }
  else {
    ship_name._4_4_ = 2;
    new_ship.data = (Am_Object_Data *)anon_var_dwarf_2f49;
  }
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,(uint)SHIP_TYPE,(ulong)ship_name._4_4_);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)(ship_type - 10));
  uVar2 = Am_Object::Set(uVar2,0x65,(ulong)(l - 10));
  AVar1 = TB_LIST;
  Am_Value_List::Am_Value_List(local_60);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_60);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar2,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar5);
  Am_Object::Am_Object(&local_38,pAVar6);
  Am_Value_List::~Am_Value_List(local_60);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_68,(Am_Object *)&local_38);
  Am_Object::Add_Part((Am_Object *)&SP_Ship_Agg,SUB81(&local_68,0),1);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Get_Object((ushort)&local_70,(ulong)&local_38);
  Am_Object::Set((ushort)&local_70,(char *)0xab,(ulong)new_ship.data);
  Am_Object::~Am_Object(&local_70);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Object::Set((ushort)command_obj,(Am_Wrapper *)0x169,(ulong)pAVar5);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, create_ship, (Am_Object command_obj))
{
  // Incoming coordinates are w.r.t. clip-win.  Translate them to short-agg.
  int clip_x = SP_Ship_Creator.Get(Am_FIRST_X);
  int clip_y = SP_Ship_Creator.Get(Am_FIRST_Y);
  int x, y;
  Am_Translate_Coordinates(SP_Clip_Win, clip_x, clip_y, SP_Ship_Agg, x, y);
  // SP_Trans_Clip_Ship_Coords (clip_x, clip_y, x, y);
  SP_Ship_Type ship_type;

  // Decide type of ship by whether event was in upper half or lower half
  // of clip window
  int l = SP_Clip_Win.Get(Am_HEIGHT);
  const char *ship_name;
  if (clip_y < (l / 2)) {
    ship_type = FEDERATION;
    ship_name = "Federation";
  } else {
    ship_type = KLINGON;
    ship_name = "Klingon";
  }

  Am_Object new_ship = SP_Ship.Create()
                           .Set(SHIP_TYPE, ship_type)
                           .Set(Am_LEFT, x - 10)
                           .Set(Am_TOP, y - 10)
                           .Add(TB_LIST, Am_Value_List());
  SP_Ship_Agg.Add_Part(new_ship);

  // Don't write a formula for SHIP_LABEL because it is set by
  // the text interactor.
  new_ship.Get_Object(SHIP_LABEL).Set(Am_TEXT, ship_name);

  // now set up for Undo
  command_obj.Set(Am_VALUE, new_ship);
  //  Am_Call(Am_Object_Proc, Am_Command, Am_DO_METHOD, (command_obj));
}